

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optTyped_valueConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
TestBody(optTyped_valueConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
         *this)

{
  bool bVar1;
  long *rhs;
  value_type_conflict1 *lhs;
  char *pcVar2;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  if ((this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1 != -1) {
    local_20[0] = (internal)0x1;
    local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lhs = &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1;
    if (*lhs != -1) {
      local_20[0] = (internal)0x1;
      local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*lhs !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          0xffffffffffffffff) {
        local_30.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*lhs;
        testing::internal::CmpHelperEQ<long,long>
                  (local_20,"this->value_1","*make()",lhs,(long *)&local_30);
        if (local_20[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_30);
          if (local_18.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                     ,0x182,pcVar2);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
          testing::internal::AssertHelper::~AssertHelper(&local_28);
          if (local_30.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_30.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_30.ptr_ + 8))();
            }
            local_30.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*lhs !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            0xffffffffffffffff) {
          local_30.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*lhs;
          rhs = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::value
                          ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&local_30);
          testing::internal::CmpHelperEQ<long,long>
                    (local_20,"this->value_1","make().value()",lhs,rhs);
          if (local_20[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_30);
            if (local_18.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                       ,0x183,pcVar2);
            testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            if (local_30.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_30.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_30.ptr_ + 8))();
              }
              local_30.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*lhs !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              0xffffffffffffffff) {
            local_30.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*lhs;
            testing::internal::CmpHelperEQ<long,long>
                      (local_20,"this->value_1","make().value_or(this->value_2)",lhs,
                       (long *)&local_30);
            if (local_20[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_30);
              if (local_18.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_28,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                         ,0x184,pcVar2);
              testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
              testing::internal::AssertHelper::~AssertHelper(&local_28);
              if (local_30.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_30.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_30.ptr_ + 8))();
                }
                local_30.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_18,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            return;
          }
        }
      }
    }
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                0x7e,
                "mp::opt<long, mp::opt_null_value_policy<long, -1>>::opt(U &&) [T = long, Policy = mp::opt_null_value_policy<long, -1>, U = const long &]"
               );
}

Assistant:

explicit weekday_mask(std::initializer_list<weekday> days)
    {
      for(auto d : days)
        mask_ |= (1 << d.get());
    }